

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::MatMul_x86_avx512::forward
          (MatMul_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  size_t sVar1;
  Allocator *pAVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  void **ppvVar12;
  pointer pMVar13;
  pointer pMVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  pointer pMVar17;
  Option *pOVar18;
  pointer pMVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int *piVar23;
  Mat *pMVar24;
  size_t sVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  Mat *pMVar29;
  void *pvVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  Allocator *pAVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  Mat local_1d8;
  ulong local_190;
  Allocator *local_188;
  ulong local_180;
  ulong local_178;
  allocator_type local_169;
  Allocator *local_168;
  MatMul_x86_avx512 *local_160;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs;
  int local_140;
  Allocator *local_138;
  int local_130;
  int aiStack_12c [5];
  size_t local_118;
  Option *local_108;
  Mat *local_100;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_3;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  int local_c0;
  size_t local_b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_5;
  int local_80;
  Allocator *local_78;
  int local_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  size_t local_58;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _top_blobs;
  
  uVar16 = local_1d8.elemsize._4_4_;
  uVar15 = (undefined4)local_1d8.elemsize;
  pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar29 = pMVar24 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar26 = pMVar24->dims;
  uVar27 = pMVar24[1].dims;
  uVar3 = uVar27;
  if ((int)uVar27 < (int)uVar26) {
    uVar3 = uVar26;
  }
  local_160 = this;
  local_108 = opt;
  if ((uVar26 ^ 1) == 0 && (uVar27 ^ 1) == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&_bottom_blobs,2,(allocator_type *)&local_1d8);
    Mat::reshape(&local_1d8,pMVar24,pMVar24->w,1,(Allocator *)0x0);
    pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != &local_1d8) {
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + 1;
        UNLOCK();
      }
      piVar23 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->refcount;
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
          else {
            (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar13->cstep = 0;
      pMVar13->data = (void *)0x0;
      pMVar13->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
      pMVar13->c = 0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->d = 0;
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      pMVar13->data = local_1d8.data;
      pMVar13->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      pMVar13->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      pMVar13->elempack = local_1d8.elempack;
      pMVar13->allocator = local_1d8.allocator;
      pMVar13->dims = local_1d8.dims;
      pMVar13->w = local_1d8.w;
      pMVar13->h = local_1d8.h;
      pMVar13->d = local_1d8.d;
      pMVar13->c = local_1d8.c;
      pMVar13->cstep = local_1d8.cstep;
    }
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar20 = 1;
    iVar33 = pMVar24[1].w;
    if ((local_160->super_MatMul).transB == 0) {
      iVar20 = pMVar24[1].w;
      iVar33 = 1;
    }
    Mat::reshape(&local_1d8,pMVar29,iVar33,iVar20,(Allocator *)0x0);
    pOVar18 = local_108;
    piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start + 1 != &local_1d8) {
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + 1;
        UNLOCK();
      }
      piVar23 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].refcount;
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
          else {
            (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].data = local_1d8.data;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].refcount =
           (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elemsize =
           CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elempack = local_1d8.elempack;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].allocator = local_1d8.allocator;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].dims = local_1d8.dims;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].w = local_1d8.w;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].h = local_1d8.h;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].d = local_1d8.d;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].c = local_1d8.c;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].cstep = local_1d8.cstep;
    }
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*local_160->gemm->_vptr_Layer[6])(local_160->gemm,&_bottom_blobs,top_blobs,pOVar18);
    Mat::reshape(&local_1d8,this_00,1,pOVar18->blob_allocator);
    piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (this_00 != &local_1d8) {
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + 1;
        UNLOCK();
      }
      piVar23 = this_00->refcount;
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      this_00->data = local_1d8.data;
      this_00->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      this_00->elempack = local_1d8.elempack;
      this_00->allocator = local_1d8.allocator;
      this_00->dims = local_1d8.dims;
      this_00->w = local_1d8.w;
      this_00->h = local_1d8.h;
      this_00->d = local_1d8.d;
      this_00->c = local_1d8.c;
      this_00->cstep = local_1d8.cstep;
    }
    if (piVar23 == (int *)0x0) goto LAB_004f15b5;
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 != 0) goto LAB_004f15b5;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_004f15b5;
    }
  }
  else {
    if ((uVar26 ^ 2) == 0 && (uVar27 ^ 2) == 0) {
      (*this->gemm->_vptr_Layer[6])(this->gemm,bottom_blobs,top_blobs,opt);
      return 0;
    }
    if ((uVar26 ^ 1) == 0 && (uVar27 ^ 2) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1d8);
      Mat::reshape(&local_1d8,pMVar24,pMVar24->w,1,(Allocator *)0x0);
      pOVar18 = local_108;
      pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != &local_1d8) {
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + 1;
          UNLOCK();
        }
        piVar23 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar13->cstep = 0;
        pMVar13->data = (void *)0x0;
        pMVar13->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
        pMVar13->c = 0;
        pMVar13->dims = 0;
        pMVar13->w = 0;
        pMVar13->h = 0;
        pMVar13->d = 0;
        piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar13->data = local_1d8.data;
        pMVar13->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar13->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        pMVar13->elempack = local_1d8.elempack;
        pMVar13->allocator = local_1d8.allocator;
        pMVar13->dims = local_1d8.dims;
        pMVar13->w = local_1d8.w;
        pMVar13->h = local_1d8.h;
        pMVar13->d = local_1d8.d;
        pMVar13->c = local_1d8.c;
        pMVar13->cstep = local_1d8.cstep;
      }
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar24) {
        piVar23 = pMVar24[1].refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + 1;
          UNLOCK();
        }
        piVar23 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].refcount + 4) = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = (void *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = (int *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = 0;
        piVar23 = pMVar24[1].refcount;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = pMVar24[1].data;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = piVar23;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize = pMVar24[1].elemsize;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = pMVar24[1].elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = pMVar24[1].allocator;
        iVar33 = pMVar24[1].w;
        iVar20 = pMVar24[1].h;
        iVar28 = pMVar24[1].d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = pMVar24[1].dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = iVar33;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = iVar20;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = iVar28;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = pMVar24[1].c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = pMVar24[1].cstep;
      }
      (*local_160->gemm->_vptr_Layer[6])(local_160->gemm,&_bottom_blobs,top_blobs,pOVar18);
      Mat::reshape(&local_1d8,this_00,this_00->w,pOVar18->blob_allocator);
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (this_00 != &local_1d8) {
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + 1;
          UNLOCK();
        }
        piVar23 = this_00->refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->data = local_1d8.data;
        this_00->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        this_00->elempack = local_1d8.elempack;
        this_00->allocator = local_1d8.allocator;
        this_00->dims = local_1d8.dims;
        this_00->w = local_1d8.w;
        this_00->h = local_1d8.h;
        this_00->d = local_1d8.d;
        this_00->c = local_1d8.c;
        this_00->cstep = local_1d8.cstep;
      }
      if (piVar23 == (int *)0x0) goto LAB_004f15b5;
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 != 0) goto LAB_004f15b5;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        goto LAB_004f15b5;
      }
    }
    else {
      if ((uVar26 ^ 2) != 0 || (uVar27 ^ 1) != 0) {
        sVar1 = pMVar24->elemsize;
        if ((int)uVar27 < 3 || uVar26 != 1) {
          if ((int)uVar26 < 3 || uVar27 != 1) {
            local_1d8.elemsize._0_4_ = (undefined4)sVar1;
            local_1d8.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
            if (uVar3 == 4) {
              if (uVar26 == 3) {
                local_1d8.elemsize._0_4_ = uVar15;
                local_1d8.elemsize._4_4_ = uVar16;
                Mat::reshape(&local_1d8,pMVar24,pMVar24->w,pMVar24->h,pMVar24->c,1,(Allocator *)0x0)
                ;
              }
              else {
                piVar23 = pMVar24->refcount;
                local_1d8.data = pMVar24->data;
                local_1d8.refcount._0_4_ = SUB84(pMVar24->refcount,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)pMVar24->refcount >> 0x20);
                local_1d8.elempack = pMVar24->elempack;
                local_1d8.allocator = pMVar24->allocator;
                uVar8 = pMVar24->w;
                uVar9 = pMVar24->h;
                uVar10 = pMVar24->d;
                uVar11 = pMVar24->c;
                local_1d8.cstep = pMVar24->cstep;
                local_1d8.dims = uVar26;
                local_1d8.w = uVar8;
                local_1d8.h = uVar9;
                local_1d8.d = uVar10;
                local_1d8.c = uVar11;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + 1;
                  UNLOCK();
                }
              }
              if (uVar27 == 3) {
                Mat::reshape((Mat *)&_bottom_blobs,pMVar29,pMVar24[1].w,pMVar24[1].h,pMVar24[1].c,1,
                             (Allocator *)0x0);
              }
              else {
                piVar23 = pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar24[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar24[1].elemsize;
                local_140 = pMVar24[1].elempack;
                local_138 = pMVar24[1].allocator;
                local_130 = pMVar24[1].dims;
                aiStack_12c[0] = pMVar24[1].w;
                aiStack_12c[1] = pMVar24[1].h;
                aiStack_12c[2] = pMVar24[1].d;
                aiStack_12c[3] = pMVar24[1].c;
                local_118 = pMVar24[1].cstep;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + 1;
                  UNLOCK();
                }
              }
              uVar26 = aiStack_12c[2];
              if (aiStack_12c[2] < local_1d8.d) {
                uVar26 = local_1d8.d;
              }
              uVar31 = (ulong)uVar26;
              uVar27 = aiStack_12c[3];
              if (aiStack_12c[3] < local_1d8.c) {
                uVar27 = local_1d8.c;
              }
              pMVar29 = (Mat *)(ulong)uVar27;
              Mat::create(this_00,aiStack_12c[(local_160->super_MatMul).transB != 0],local_1d8.h,
                          uVar26,uVar27,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_138 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_138->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar23 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_004f21f5;
              }
              if ((int)uVar26 < 1) {
                uVar31 = 0;
              }
              if ((int)uVar27 < 1) {
                pMVar29 = (Mat *)0x0;
              }
              pMVar24 = (Mat *)0x0;
              local_180 = uVar31;
              while (pMVar24 != pMVar29) {
                local_190 = (ulong)pMVar24 & 0xffffffff;
                local_178 = local_190;
                if (local_1d8.c == 1) {
                  local_178 = 0;
                }
                if (aiStack_12c[3] == 1) {
                  local_190 = 0;
                }
                uVar31 = 0;
                local_100 = pMVar24;
                while( true ) {
                  iVar33 = local_1d8.d;
                  if (local_180 == uVar31) break;
                  iVar32 = aiStack_12c[2];
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                  pMVar13 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  iVar28 = local_1d8.h;
                  iVar20 = local_1d8.w;
                  pvVar30 = local_1d8.data;
                  lVar40 = (long)local_1d8.w;
                  lVar39 = (long)local_1d8.h;
                  lVar38 = local_1d8.cstep * local_178;
                  sVar1 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                  uVar37 = uVar31;
                  if (iVar33 == 1) {
                    uVar37 = 0;
                  }
                  piVar23 = (_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  pAVar35 = local_1d8.allocator;
                  iVar33 = local_1d8.elempack;
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      local_168 = local_1d8.allocator;
                      local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_1d8.elempack);
                      if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                        pAVar35 = local_168;
                        iVar33 = (int)local_188;
                      }
                      else {
                        (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3]
                        )();
                        pAVar35 = local_168;
                        iVar33 = (int)local_188;
                      }
                    }
                  }
                  pMVar19 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pMVar14 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pMVar17 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pMVar13->data =
                       (void *)((long)pvVar30 + uVar37 * lVar39 * lVar40 * sVar1 + lVar38 * sVar1);
                  pMVar13->refcount = (int *)0x0;
                  pMVar13->elemsize = sVar1;
                  pMVar13->elempack = iVar33;
                  pMVar13->allocator = pAVar35;
                  pMVar13->dims = 2;
                  pMVar13->w = iVar20;
                  pMVar13->h = iVar28;
                  pMVar13->d = 1;
                  pMVar13->c = 1;
                  pMVar13->cstep = lVar39 * lVar40;
                  iVar33 = aiStack_12c[1];
                  lVar38 = (long)aiStack_12c[1];
                  lVar40 = local_118 * local_190 *
                           (long)_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
                  piVar23 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start[1].refcount;
                  uVar37 = uVar31;
                  if (iVar32 == 1) {
                    uVar37 = 0;
                  }
                  pAVar35 = local_138;
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      local_188 = local_138;
                      if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0)
                      {
                        free(_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start[1].data);
                        pAVar35 = local_188;
                      }
                      else {
                        (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                          [3])();
                        pAVar35 = local_188;
                      }
                    }
                  }
                  pMVar19[1].data =
                       (void *)((long)&pMVar17->data +
                               uVar37 * lVar38 * aiStack_12c[0] * (long)pMVar14 + lVar40);
                  pMVar19[1].refcount = (int *)0x0;
                  pMVar19[1].elemsize = (size_t)pMVar14;
                  pMVar19[1].elempack = local_140;
                  pMVar19[1].allocator = pAVar35;
                  pMVar19[1].dims = 2;
                  pMVar19[1].w = aiStack_12c[0];
                  pMVar19[1].h = iVar33;
                  pMVar19[1].d = 1;
                  pMVar19[1].c = 1;
                  pMVar19[1].cstep = lVar38 * aiStack_12c[0];
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                  pMVar13 = _bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  iVar33 = this_00->w;
                  iVar20 = this_00->h;
                  lVar40 = this_00->cstep * (long)local_100;
                  sVar1 = this_00->elemsize;
                  pvVar30 = this_00->data;
                  iVar28 = this_00->elempack;
                  pAVar35 = this_00->allocator;
                  piVar23 = (_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  if (piVar23 != (int *)0x0) {
                    LOCK();
                    *piVar23 = *piVar23 + -1;
                    UNLOCK();
                    if (*piVar23 == 0) {
                      if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                      }
                      else {
                        (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3]
                        )();
                      }
                    }
                  }
                  sVar25 = (long)iVar20 * (long)iVar33;
                  pMVar13->data = (void *)((long)pvVar30 + uVar31 * sVar1 * sVar25 + lVar40 * sVar1)
                  ;
                  pMVar13->refcount = (int *)0x0;
                  pMVar13->elemsize = sVar1;
                  pMVar13->elempack = iVar28;
                  pMVar13->allocator = pAVar35;
                  pMVar13->dims = 2;
                  pMVar13->w = iVar33;
                  pMVar13->h = iVar20;
                  pMVar13->d = 1;
                  pMVar13->c = 1;
                  pMVar13->cstep = sVar25;
                  (*local_160->gemm->_vptr_Layer[6])
                            (local_160->gemm,&_bottom_blobs_5,&_bottom_blobs_3,local_108);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                  uVar31 = uVar31 + 1;
                }
                pMVar24 = (Mat *)((long)&local_100->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_138 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (*local_138->_vptr_Allocator[3])();
                  }
                }
              }
              piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar23 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 != 0) {
                return 0;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            else {
              if (uVar3 != 3) {
                fprintf(_stderr,"impossible matmul %d %d",(ulong)uVar26,(ulong)uVar27);
                fputc(10,_stderr);
                return -1;
              }
              if (uVar26 == 2) {
                local_1d8.elemsize._0_4_ = uVar15;
                local_1d8.elemsize._4_4_ = uVar16;
                Mat::reshape(&local_1d8,pMVar24,pMVar24->w,pMVar24->h,1,(Allocator *)0x0);
              }
              else {
                piVar23 = pMVar24->refcount;
                local_1d8.data = pMVar24->data;
                local_1d8.refcount._0_4_ = SUB84(pMVar24->refcount,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)pMVar24->refcount >> 0x20);
                local_1d8.elempack = pMVar24->elempack;
                local_1d8.allocator = pMVar24->allocator;
                uVar4 = pMVar24->w;
                uVar5 = pMVar24->h;
                uVar6 = pMVar24->d;
                uVar7 = pMVar24->c;
                local_1d8.cstep = pMVar24->cstep;
                local_1d8.dims = uVar26;
                local_1d8.w = uVar4;
                local_1d8.h = uVar5;
                local_1d8.d = uVar6;
                local_1d8.c = uVar7;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + 1;
                  UNLOCK();
                }
              }
              if (uVar27 == 2) {
                Mat::reshape((Mat *)&_bottom_blobs,pMVar29,pMVar24[1].w,pMVar24[1].h,1,
                             (Allocator *)0x0);
              }
              else {
                piVar23 = pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar24[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar24[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar24[1].elemsize;
                local_140 = pMVar24[1].elempack;
                local_138 = pMVar24[1].allocator;
                local_130 = pMVar24[1].dims;
                aiStack_12c[0] = pMVar24[1].w;
                aiStack_12c[1] = pMVar24[1].h;
                aiStack_12c[2] = pMVar24[1].d;
                aiStack_12c[3] = pMVar24[1].c;
                local_118 = pMVar24[1].cstep;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + 1;
                  UNLOCK();
                }
              }
              uVar26 = aiStack_12c[3];
              if (aiStack_12c[3] < local_1d8.c) {
                uVar26 = local_1d8.c;
              }
              pMVar29 = (Mat *)(ulong)uVar26;
              Mat::create(this_00,aiStack_12c[(local_160->super_MatMul).transB != 0],local_1d8.h,
                          uVar26,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_138 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_138->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar23 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
LAB_004f21f5:
                free(local_1d8.data);
                return -100;
              }
              if ((int)uVar26 < 1) {
                pMVar29 = (Mat *)0x0;
              }
              pMVar24 = (Mat *)0x0;
              local_100 = pMVar29;
              while( true ) {
                iVar20 = aiStack_12c[3];
                iVar33 = local_1d8.c;
                if (local_100 == pMVar24) break;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                pMVar13 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                iVar32 = local_1d8.dims;
                iVar28 = local_1d8.elempack;
                uVar31 = (ulong)local_1d8.w;
                uVar37 = (ulong)local_1d8.h;
                pMVar29 = pMVar24;
                if (iVar33 == 1) {
                  pMVar29 = (Mat *)0x0;
                }
                uVar21 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                pvVar30 = (void *)((long)pMVar29 * local_1d8.cstep * uVar21 + (long)local_1d8.data);
                uVar22 = (uVar21 * uVar37 * uVar31 + 0xf & 0xfffffffffffffff0) / uVar21;
                if (local_1d8.dims == 4) {
                  uVar22 = uVar37 * uVar31;
                }
                piVar23 = (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                pAVar35 = local_1d8.allocator;
                uVar26 = local_1d8.d;
                iVar33 = local_1d8.w;
                iVar36 = local_1d8.h;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + -1;
                  UNLOCK();
                  if (*piVar23 == 0) {
                    local_188 = local_1d8.allocator;
                    local_180 = CONCAT44(local_180._4_4_,local_1d8.d);
                    local_178 = uVar31;
                    local_190 = uVar37;
                    if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                      free((_bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      iVar33 = (int)local_178;
                      iVar36 = (int)local_190;
                      pAVar35 = local_188;
                      uVar26 = (uint)local_180;
                    }
                    else {
                      (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])()
                      ;
                      iVar33 = (int)local_178;
                      iVar36 = (int)local_190;
                      pAVar35 = local_188;
                      uVar26 = (uint)local_180;
                    }
                  }
                }
                pMVar14 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar17 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                pMVar13->refcount = (int *)0x0;
                pMVar13->data = pvVar30;
                pMVar13->elemsize = uVar21;
                pMVar13->elempack = iVar28;
                pMVar13->allocator = pAVar35;
                pMVar13->dims = iVar32 - 1;
                pMVar13->w = iVar33;
                pMVar13->h = iVar36;
                pMVar13->d = 1;
                pMVar13->c = uVar26;
                pMVar13->cstep = uVar22;
                uVar31 = (ulong)aiStack_12c[0];
                iVar33 = aiStack_12c[1];
                pMVar29 = pMVar24;
                if (iVar20 == 1) {
                  pMVar29 = (Mat *)0x0;
                }
                lVar40 = (long)pMVar29 * local_118 *
                         (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
                ppvVar12 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data;
                uVar21 = (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage *
                         (long)aiStack_12c[1] * uVar31 + 0xf & 0xfffffffffffffff0;
                uVar37 = uVar21 / (ulong)_bottom_blobs.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_130 == 4) {
                  uVar37 = (long)aiStack_12c[1] * uVar31;
                }
                piVar23 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].refcount;
                iVar28 = aiStack_12c[2];
                iVar20 = aiStack_12c[0];
                iVar32 = local_140;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + -1;
                  UNLOCK();
                  if (*piVar23 == 0) {
                    local_190 = CONCAT44(local_190._4_4_,local_140);
                    local_180 = CONCAT44(local_180._4_4_,aiStack_12c[2]);
                    pAVar35 = _bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start[1].allocator;
                    local_178 = uVar31;
                    if (pAVar35 == (Allocator *)0x0) {
                      free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].data);
                      iVar20 = (int)local_178;
                      iVar28 = (uint)local_180;
                      iVar32 = (uint)local_190;
                    }
                    else {
                      (*pAVar35->_vptr_Allocator[3])
                                (pAVar35,_bottom_blobs_5.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start[1].data,
                                 uVar21 % (ulong)_bottom_blobs.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                      ;
                      iVar20 = (int)local_178;
                      iVar28 = (uint)local_180;
                      iVar32 = (uint)local_190;
                    }
                  }
                }
                pMVar14[1].data = (void **)((long)ppvVar12 + lVar40);
                pMVar14[1].refcount = (int *)0x0;
                pMVar14[1].elemsize = (size_t)pMVar17;
                pMVar14[1].elempack = iVar32;
                pMVar14[1].allocator = local_138;
                pMVar14[1].dims = local_130 + -1;
                pMVar14[1].w = iVar20;
                pMVar14[1].h = iVar33;
                pMVar14[1].d = 1;
                pMVar14[1].c = iVar28;
                pMVar14[1].cstep = uVar37;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                uVar21 = (ulong)this_00->w;
                iVar33 = this_00->h;
                iVar20 = this_00->d;
                sVar1 = this_00->cstep;
                uVar31 = this_00->elemsize;
                pvVar30 = this_00->data;
                iVar28 = this_00->elempack;
                pAVar35 = this_00->allocator;
                uVar34 = (long)iVar33 * uVar21;
                uVar22 = uVar34 * uVar31 + 0xf & 0xfffffffffffffff0;
                iVar32 = this_00->dims;
                uVar37 = uVar22 / uVar31;
                if (iVar32 == 4) {
                  uVar37 = uVar34;
                }
                piVar23 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + -1;
                  UNLOCK();
                  if (*piVar23 == 0) {
                    local_190 = CONCAT44(local_190._4_4_,iVar28);
                    local_180 = CONCAT44(local_180._4_4_,iVar20);
                    pAVar2 = (_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->allocator;
                    local_178 = uVar21;
                    if (pAVar2 == (Allocator *)0x0) {
                      free((_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      uVar21 = local_178;
                      iVar20 = (uint)local_180;
                      iVar28 = (uint)local_190;
                    }
                    else {
                      (*pAVar2->_vptr_Allocator[3])
                                (pAVar2,(_bottom_blobs_3.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->data,
                                 uVar22 % uVar31);
                      uVar21 = local_178;
                      iVar20 = (uint)local_180;
                      iVar28 = (uint)local_190;
                    }
                  }
                }
                pMVar13->data = (void *)(sVar1 * (long)pMVar24 * uVar31 + (long)pvVar30);
                pMVar13->refcount = (int *)0x0;
                pMVar13->elemsize = uVar31;
                pMVar13->elempack = iVar28;
                pMVar13->allocator = pAVar35;
                pMVar13->dims = iVar32 + -1;
                pMVar13->w = (int)uVar21;
                pMVar13->h = iVar33;
                pMVar13->d = 1;
                pMVar13->c = iVar20;
                pMVar13->cstep = uVar37;
                (*local_160->gemm->_vptr_Layer[6])
                          (local_160->gemm,&_bottom_blobs_5,&_bottom_blobs_3,local_108);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_138 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (*local_138->_vptr_Allocator[3])();
                  }
                }
              }
              piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar23 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 != 0) {
                return 0;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            goto LAB_004f2670;
          }
          iVar33 = pMVar24->h;
          uVar27 = pMVar24->c * pMVar24->d;
          local_180 = (ulong)uVar27;
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          Mat::create(&local_1d8,1,iVar33,uVar27,sVar1,opt->blob_allocator);
          if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
            piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar23 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 != 0) {
              return -100;
            }
            if (local_1d8.allocator != (Allocator *)0x0) {
              (*(local_1d8.allocator)->_vptr_Allocator[3])();
              return -100;
            }
            goto LAB_004f21f5;
          }
          Mat::reshape((Mat *)&_bottom_blobs,pMVar24,pMVar24->w,pMVar24->h,(int)local_180,
                       (Allocator *)0x0);
          iVar28 = 1;
          iVar20 = pMVar24[1].w;
          if ((local_160->super_MatMul).transB == 0) {
            iVar28 = pMVar24[1].w;
            iVar20 = 1;
          }
          uVar31 = 0;
          Mat::reshape((Mat *)&_bottom_blobs_5,pMVar29,iVar20,iVar28,(Allocator *)0x0);
          iVar20 = (int)local_180;
          local_180 = local_180 & 0xffffffff;
          local_100 = pMVar24;
          if (iVar20 < 1) {
            local_180 = uVar31;
          }
          for (; local_180 != uVar31; uVar31 = uVar31 + 1) {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
            pMVar17 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar22 = (ulong)aiStack_12c[0];
            iVar20 = aiStack_12c[1];
            lVar40 = local_118 * uVar31 *
                     (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppvVar12 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->data;
            uVar21 = (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage *
                     (long)aiStack_12c[1] * uVar22 + 0xf & 0xfffffffffffffff0;
            uVar37 = uVar21 / (ulong)_bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_130 == 4) {
              uVar37 = (long)aiStack_12c[1] * uVar22;
            }
            piVar23 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            pAVar35 = local_138;
            iVar32 = aiStack_12c[2];
            iVar28 = aiStack_12c[0];
            iVar36 = local_140;
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                local_168 = local_138;
                local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_140);
                local_178 = CONCAT44(local_178._4_4_,aiStack_12c[2]);
                pAVar35 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator;
                local_190 = uVar22;
                if (pAVar35 == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                  iVar28 = (int)local_190;
                  pAVar35 = local_168;
                  iVar32 = (uint)local_178;
                  iVar36 = (int)local_188;
                }
                else {
                  (*pAVar35->_vptr_Allocator[3])
                            (pAVar35,(_bottom_blobs_3.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar21 % (ulong)_bottom_blobs.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar28 = (int)local_190;
                  pAVar35 = local_168;
                  iVar32 = (uint)local_178;
                  iVar36 = (int)local_188;
                }
              }
            }
            pMVar14 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar17->data = (void **)((long)ppvVar12 + lVar40);
            pMVar17->refcount = (int *)0x0;
            pMVar17->elemsize = (size_t)pMVar13;
            pMVar17->elempack = iVar36;
            pMVar17->allocator = pAVar35;
            pMVar17->dims = local_130 + -1;
            pMVar17->w = iVar28;
            pMVar17->h = iVar20;
            pMVar17->d = 1;
            pMVar17->c = iVar32;
            pMVar17->cstep = uVar37;
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start + 1 != (pointer)&_bottom_blobs_5) {
              if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_5.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar23 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].refcount;
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                    free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].data);
                  }
                  else {
                    (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])()
                    ;
                  }
                }
              }
              pMVar14[1].data =
                   _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pMVar14[1].refcount =
                   (int *)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              pMVar14[1].elemsize =
                   (size_t)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pMVar14[1].elempack = local_80;
              pMVar14[1].allocator = local_78;
              pMVar14[1].dims = local_70;
              pMVar14[1].w = iStack_6c;
              pMVar14[1].h = iStack_68;
              pMVar14[1].d = iStack_64;
              pMVar14[1].c = local_60;
              pMVar14[1].cstep = local_58;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_169);
            pMVar13 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar28 = local_1d8.h;
            iVar20 = local_1d8.dims;
            uVar34 = (ulong)local_1d8.w;
            uVar37 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
            pvVar30 = (void *)(local_1d8.cstep * uVar31 * uVar37 + (long)local_1d8.data);
            uVar22 = uVar37 * (long)local_1d8.h * uVar34 + 0xf & 0xfffffffffffffff0;
            uVar21 = uVar22 / uVar37;
            if (local_1d8.dims == 4) {
              uVar21 = (long)local_1d8.h * uVar34;
            }
            piVar23 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            pAVar35 = local_1d8.allocator;
            uVar27 = local_1d8.d;
            iVar32 = local_1d8.w;
            iVar36 = local_1d8.elempack;
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                local_168 = local_1d8.allocator;
                local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_1d8.elempack);
                local_178 = CONCAT44(local_178._4_4_,local_1d8.d);
                pAVar35 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator;
                local_190 = uVar34;
                if (pAVar35 == (Allocator *)0x0) {
                  free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                        .super__Vector_impl_data._M_start)->data);
                  iVar32 = (int)local_190;
                  pAVar35 = local_168;
                  uVar27 = (uint)local_178;
                  iVar36 = (int)local_188;
                }
                else {
                  (*pAVar35->_vptr_Allocator[3])
                            (pAVar35,(_top_blobs.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar22 % uVar37);
                  iVar32 = (int)local_190;
                  pAVar35 = local_168;
                  uVar27 = (uint)local_178;
                  iVar36 = (int)local_188;
                }
              }
            }
            opt = local_108;
            pMVar13->data = pvVar30;
            pMVar13->refcount = (int *)0x0;
            pMVar13->elemsize = uVar37;
            pMVar13->elempack = iVar36;
            pMVar13->allocator = pAVar35;
            pMVar13->dims = iVar20 - 1;
            pMVar13->w = iVar32;
            pMVar13->h = iVar28;
            pMVar13->d = 1;
            pMVar13->c = uVar27;
            pMVar13->cstep = uVar21;
            (*local_160->gemm->_vptr_Layer[6])
                      (local_160->gemm,&_bottom_blobs_3,&_top_blobs,local_108);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
          }
          if (uVar26 == 3) {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,iVar33,local_100->c * local_100->d,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar23 = this_00->refcount;
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_e0;
              this_00->allocator = local_d8;
              this_00->dims = local_d0;
              this_00->w = iStack_cc;
              this_00->h = iStack_c8;
              this_00->d = iStack_c4;
              this_00->c = local_c0;
              this_00->cstep = local_b8;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d8 == (Allocator *)0x0) {
LAB_004f25c9:
                  free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*local_d8->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,iVar33,local_100->d,local_100->c,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar23 = this_00->refcount;
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_e0;
              this_00->allocator = local_d8;
              this_00->dims = local_d0;
              this_00->w = iStack_cc;
              this_00->h = iStack_c8;
              this_00->d = iStack_c4;
              this_00->c = local_c0;
              this_00->cstep = local_b8;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d8 == (Allocator *)0x0) goto LAB_004f25c9;
                (*local_d8->_vptr_Allocator[3])();
              }
            }
          }
          if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_78 == (Allocator *)0x0) {
                free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (*local_78->_vptr_Allocator[3])();
              }
            }
          }
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_138 == (Allocator *)0x0) {
                free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                     .super__Vector_impl_data._M_start);
              }
              else {
                (*local_138->_vptr_Allocator[3])();
              }
            }
          }
          piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar23 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 != 0) {
            return 0;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            return 0;
          }
          goto LAB_004f2670;
        }
        iVar33 = (&pMVar24[1].w)[(this->super_MatMul).transB != 0];
        uVar26 = pMVar24[1].c * pMVar24[1].d;
        local_180 = (ulong)uVar26;
        local_1d8.cstep = 0;
        local_1d8.data = (void *)0x0;
        local_1d8.refcount._0_4_ = 0;
        local_1d8.refcount._4_4_ = 0;
        local_1d8.elemsize._0_4_ = 0;
        local_1d8.elemsize._4_4_ = 0;
        local_1d8.elempack = 0;
        local_1d8.allocator = (Allocator *)0x0;
        local_1d8.dims = 0;
        local_1d8.w = 0;
        local_1d8.h = 0;
        local_1d8.d = 0;
        local_1d8.c = 0;
        Mat::create(&local_1d8,iVar33,1,uVar26,sVar1,opt->blob_allocator);
        if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
          piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar23 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 != 0) {
            return -100;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            return -100;
          }
          goto LAB_004f21f5;
        }
        Mat::reshape((Mat *)&_bottom_blobs,pMVar24,pMVar24->w,1,(Allocator *)0x0);
        uVar31 = local_180;
        iVar20 = (int)local_180;
        Mat::reshape((Mat *)&_bottom_blobs_5,pMVar29,pMVar24[1].w,pMVar24[1].h,iVar20,
                     (Allocator *)0x0);
        local_180 = uVar31 & 0xffffffff;
        if (iVar20 < 1) {
          local_180 = 0;
        }
        local_178 = CONCAT44(local_178._4_4_,uVar27);
        local_100 = pMVar24;
        for (uVar31 = 0; local_180 != uVar31; uVar31 = uVar31 + 1) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
          pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)&_bottom_blobs) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar23 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                }
                else {
                  (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar13->cstep = 0;
            pMVar13->data = (void *)0x0;
            pMVar13->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
            pMVar13->c = 0;
            pMVar13->dims = 0;
            pMVar13->w = 0;
            pMVar13->h = 0;
            pMVar13->d = 0;
            pMVar13->data =
                 _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pMVar13->refcount =
                 (int *)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            pMVar13->elemsize =
                 (size_t)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            pMVar13->elempack = local_140;
            pMVar13->allocator = local_138;
            pMVar13->dims = local_130;
            pMVar13->w = aiStack_12c[0];
            pMVar13->h = aiStack_12c[1];
            pMVar13->d = aiStack_12c[2];
            pMVar13->c = aiStack_12c[3];
            pMVar13->cstep = local_118;
          }
          pMVar17 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar40 = local_58 * uVar31 *
                   (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppvVar12 = &(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data;
          uVar21 = (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage *
                   (long)iStack_68 * (long)iStack_6c + 0xfU & 0xfffffffffffffff0;
          uVar37 = uVar21 / (ulong)_bottom_blobs_5.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage;
          if (local_70 == 4) {
            uVar37 = (long)iStack_68 * (long)iStack_6c;
          }
          piVar23 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].refcount;
          pAVar35 = local_78;
          iVar20 = iStack_64;
          iVar28 = local_80;
          if (piVar23 != (int *)0x0) {
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 == 0) {
              local_168 = local_78;
              local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_80);
              local_190 = CONCAT44(local_190._4_4_,iStack_64);
              pAVar35 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].allocator;
              if (pAVar35 == (Allocator *)0x0) {
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].data);
                pAVar35 = local_168;
                iVar20 = (uint)local_190;
                iVar28 = (int)local_188;
              }
              else {
                (*pAVar35->_vptr_Allocator[3])
                          (pAVar35,_bottom_blobs_3.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start[1].data,
                           uVar21 % (ulong)_bottom_blobs_5.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pAVar35 = local_168;
                iVar20 = (uint)local_190;
                iVar28 = (int)local_188;
              }
            }
          }
          pMVar13[1].data = (void **)((long)ppvVar12 + lVar40);
          pMVar13[1].refcount = (int *)0x0;
          pMVar13[1].elemsize = (size_t)pMVar17;
          pMVar13[1].elempack = iVar28;
          pMVar13[1].allocator = pAVar35;
          pMVar13[1].dims = local_70 + -1;
          pMVar13[1].w = iStack_6c;
          pMVar13[1].h = iStack_68;
          pMVar13[1].d = 1;
          pMVar13[1].c = iVar20;
          pMVar13[1].cstep = uVar37;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_169);
          pMVar13 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar32 = local_1d8.h;
          iVar28 = local_1d8.w;
          iVar20 = local_1d8.dims;
          uVar37 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
          pvVar30 = (void *)(local_1d8.cstep * uVar31 * uVar37 + (long)local_1d8.data);
          uVar22 = uVar37 * (long)local_1d8.h * (long)local_1d8.w + 0xf & 0xfffffffffffffff0;
          uVar21 = uVar22 / uVar37;
          if (local_1d8.dims == 4) {
            uVar21 = (long)local_1d8.h * (long)local_1d8.w;
          }
          piVar23 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->refcount;
          pAVar35 = local_1d8.allocator;
          uVar26 = local_1d8.d;
          iVar36 = local_1d8.elempack;
          if (piVar23 != (int *)0x0) {
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 == 0) {
              local_168 = local_1d8.allocator;
              local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_1d8.elempack);
              local_190 = CONCAT44(local_190._4_4_,local_1d8.d);
              pAVar35 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator;
              if (pAVar35 == (Allocator *)0x0) {
                free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start)->data);
                pAVar35 = local_168;
                uVar26 = (uint)local_190;
                iVar36 = (int)local_188;
              }
              else {
                (*pAVar35->_vptr_Allocator[3])
                          (pAVar35,(_top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->data,uVar22 % uVar37)
                ;
                pAVar35 = local_168;
                uVar26 = (uint)local_190;
                iVar36 = (int)local_188;
              }
            }
          }
          opt = local_108;
          pMVar13->data = pvVar30;
          pMVar13->refcount = (int *)0x0;
          pMVar13->elemsize = uVar37;
          pMVar13->elempack = iVar36;
          pMVar13->allocator = pAVar35;
          pMVar13->dims = iVar20 - 1;
          pMVar13->w = iVar28;
          pMVar13->h = iVar32;
          pMVar13->d = 1;
          pMVar13->c = uVar26;
          pMVar13->cstep = uVar21;
          (*local_160->gemm->_vptr_Layer[6])(local_160->gemm,&_bottom_blobs_3,&_top_blobs,local_108)
          ;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
          uVar27 = (uint)local_178;
        }
        if (uVar27 == 3) {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,iVar33,local_100[1].c * local_100[1].d,
                       opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar23 = this_00->refcount;
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_e0;
            this_00->allocator = local_d8;
            this_00->dims = local_d0;
            this_00->w = iStack_cc;
            this_00->h = iStack_c8;
            this_00->d = iStack_c4;
            this_00->c = local_c0;
            this_00->cstep = local_b8;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d8 == (Allocator *)0x0) {
LAB_004f236b:
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (*local_d8->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,iVar33,local_100[1].d,local_100[1].c,
                       opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar23 = this_00->refcount;
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_e0;
            this_00->allocator = local_d8;
            this_00->dims = local_d0;
            this_00->w = iStack_cc;
            this_00->h = iStack_c8;
            this_00->d = iStack_c4;
            this_00->c = local_c0;
            this_00->cstep = local_b8;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d8 == (Allocator *)0x0) goto LAB_004f236b;
              (*local_d8->_vptr_Allocator[3])();
            }
          }
        }
        if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_78 == (Allocator *)0x0) {
              free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start);
            }
            else {
              (*local_78->_vptr_Allocator[3])();
            }
          }
        }
        if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_138 == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
            else {
              (*local_138->_vptr_Allocator[3])();
            }
          }
        }
        piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar23 == (int *)0x0) {
          return 0;
        }
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 != 0) {
          return 0;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
          return 0;
        }
LAB_004f2670:
        free(local_1d8.data);
        return 0;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1d8);
      pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar24) {
        piVar23 = pMVar24->refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + 1;
          UNLOCK();
        }
        piVar23 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar13->cstep = 0;
        pMVar13->data = (void *)0x0;
        pMVar13->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
        pMVar13->c = 0;
        pMVar13->dims = 0;
        pMVar13->w = 0;
        pMVar13->h = 0;
        pMVar13->d = 0;
        piVar23 = pMVar24->refcount;
        pMVar13->data = pMVar24->data;
        pMVar13->refcount = piVar23;
        pMVar13->elemsize = pMVar24->elemsize;
        pMVar13->elempack = pMVar24->elempack;
        pMVar13->allocator = pMVar24->allocator;
        iVar33 = pMVar24->w;
        iVar20 = pMVar24->h;
        iVar28 = pMVar24->d;
        pMVar13->dims = pMVar24->dims;
        pMVar13->w = iVar33;
        pMVar13->h = iVar20;
        pMVar13->d = iVar28;
        pMVar13->c = pMVar24->c;
        pMVar13->cstep = pMVar24->cstep;
      }
      iVar20 = 1;
      iVar33 = pMVar24[1].w;
      if ((local_160->super_MatMul).transB == 0) {
        iVar20 = pMVar24[1].w;
        iVar33 = 1;
      }
      Mat::reshape(&local_1d8,pMVar29,iVar33,iVar20,(Allocator *)0x0);
      pOVar18 = local_108;
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start + 1 != &local_1d8) {
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + 1;
          UNLOCK();
        }
        piVar23 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = local_1d8.data;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount =
             (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize =
             CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = local_1d8.elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = local_1d8.allocator;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = local_1d8.dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = local_1d8.w;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = local_1d8.h;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = local_1d8.d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = local_1d8.c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = local_1d8.cstep;
      }
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*local_160->gemm->_vptr_Layer[6])(local_160->gemm,&_bottom_blobs,top_blobs,pOVar18);
      Mat::reshape(&local_1d8,this_00,this_00->h,pOVar18->blob_allocator);
      piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (this_00 != &local_1d8) {
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + 1;
          UNLOCK();
        }
        piVar23 = this_00->refcount;
        if (piVar23 != (int *)0x0) {
          LOCK();
          *piVar23 = *piVar23 + -1;
          UNLOCK();
          if (*piVar23 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar23 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->data = local_1d8.data;
        this_00->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        this_00->elempack = local_1d8.elempack;
        this_00->allocator = local_1d8.allocator;
        this_00->dims = local_1d8.dims;
        this_00->w = local_1d8.w;
        this_00->h = local_1d8.h;
        this_00->d = local_1d8.d;
        this_00->c = local_1d8.c;
        this_00->cstep = local_1d8.cstep;
      }
      if (piVar23 == (int *)0x0) goto LAB_004f15b5;
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 != 0) goto LAB_004f15b5;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        goto LAB_004f15b5;
      }
    }
  }
  free(local_1d8.data);
LAB_004f15b5:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs);
  return 0;
}

Assistant:

int MatMul_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(1, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        gemm->forward(bottom_blobs, top_blobs, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = B;
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.w, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A;
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.h, opt.blob_allocator);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1;
            _bottom_blobs[1] = B1.channel(p);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c, opt.blob_allocator);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(p);
            _bottom_blobs[1] = BT;
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c, opt.blob_allocator);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(Ap);
            _bottom_blobs[1] = B1.channel(Bp);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                std::vector<Mat> _bottom_blobs(2);
                _bottom_blobs[0] = A1.channel(Ap).depth(Ad);
                _bottom_blobs[1] = B1.channel(Bp).depth(Bd);
                std::vector<Mat> _top_blobs(1);
                _top_blobs[0] = top_blob.channel(p).depth(q);
                gemm->forward(_bottom_blobs, _top_blobs, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}